

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O2

bool __thiscall
VGradientCache::generateGradientColorTable
          (VGradientCache *this,VGradientStops *stops,float opacity,uint32_t *colorTable,int size)

{
  pointer ppVar1;
  VColor *this_00;
  float fVar2;
  float fVar3;
  float fVar4;
  uint8_t uVar5;
  pointer ppVar6;
  pointer ppVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  
  ppVar6 = (stops->
           super__Vector_base<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar7 = (stops->
           super__Vector_base<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (ppVar6->second).a;
  uVar8 = VColor::premulARGB(&ppVar6->second,opacity);
  fVar15 = 1.0 / (float)size;
  fVar16 = fVar15 * 1.5;
  *colorTable = uVar8;
  fVar2 = ppVar6->first;
  lVar14 = (long)size;
  for (lVar13 = 1; (fVar16 <= fVar2 && (lVar13 < lVar14)); lVar13 = lVar13 + 1) {
    colorTable[lVar13] = colorTable[lVar13 + -1];
    fVar16 = fVar16 + fVar15;
  }
  bVar11 = 1e-06 <= ABS(opacity + -1.0) || uVar5 != 0xff;
  for (lVar10 = 0; lVar10 != ((long)ppVar7 - (long)ppVar6 >> 3) + -1; lVar10 = lVar10 + 1) {
    ppVar1 = ppVar6 + lVar10;
    fVar2 = ppVar1[1].first;
    fVar3 = ppVar1->first;
    this_00 = &ppVar6[lVar10 + 1].second;
    uVar5 = this_00->a;
    uVar9 = VColor::premulARGB(this_00,opacity);
    fVar4 = ((pair<float,_VColor> *)(this_00 + -1))->first;
    for (lVar13 = (long)(int)lVar13; (fVar16 < fVar4 && (lVar13 < lVar14)); lVar13 = lVar13 + 1) {
      iVar12 = (int)((fVar16 - ppVar1->first) * (1.0 / (fVar2 - fVar3)) * 255.0);
      colorTable[lVar13] =
           iVar12 * (uVar9 >> 8 & 0xff00ff) + (0xff - iVar12) * (uVar8 >> 8 & 0xff00ff) & 0xff00ff00
           | (uVar9 & 0xff00ff) * iVar12 + (0xff - iVar12) * (uVar8 & 0xff00ff) >> 8 & 0xff00ff;
      fVar16 = fVar16 + fVar15;
    }
    bVar11 = (bool)(bVar11 | uVar5 != 0xff);
    uVar8 = uVar9;
  }
  for (lVar13 = (long)(int)lVar13; lVar13 < lVar14; lVar13 = lVar13 + 1) {
    colorTable[lVar13] = uVar8;
  }
  colorTable[lVar14 + -1] = uVar8;
  return bVar11;
}

Assistant:

bool VGradientCache::generateGradientColorTable(const VGradientStops &stops,
                                                float                 opacity,
                                                uint32_t *colorTable, int size)
{
    int                  dist, idist, pos = 0;
    size_t               i;
    bool                 alpha = false;
    size_t               stopCount = stops.size();
    const VGradientStop *curr, *next, *start;
    uint32_t             curColor, nextColor;
    float                delta, t, incr, fpos;

    if (!vCompare(opacity, 1.0f)) alpha = true;

    start = stops.data();
    curr = start;
    if (!curr->second.isOpaque()) alpha = true;
    curColor = curr->second.premulARGB(opacity);
    incr = 1.0f / (float)size;
    fpos = 1.5f * incr;

    colorTable[pos++] = curColor;

    while (fpos <= curr->first && pos < size) {
        colorTable[pos] = colorTable[pos - 1];
        pos++;
        fpos += incr;
    }

    for (i = 0; i < stopCount - 1; ++i) {
        curr = (start + i);
        next = (start + i + 1);
        delta = 1 / (next->first - curr->first);
        if (!next->second.isOpaque()) alpha = true;
        nextColor = next->second.premulARGB(opacity);
        while (fpos < next->first && pos < size) {
            t = (fpos - curr->first) * delta;
            dist = (int)(255 * t);
            idist = 255 - dist;
            colorTable[pos] =
                interpolate_pixel(curColor, idist, nextColor, dist);
            ++pos;
            fpos += incr;
        }
        curColor = nextColor;
    }

    for (; pos < size; ++pos) colorTable[pos] = curColor;

    // Make sure the last color stop is represented at the end of the table
    colorTable[size - 1] = curColor;
    return alpha;
}